

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

substr __thiscall c4::yml::Tree::arena(Tree *this)

{
  code *pcVar1;
  bool bVar2;
  ulong len_;
  substr sVar3;
  substr local_20;
  
  len_ = this->m_arena_pos;
  if ((len_ != 0xffffffffffffffff) && ((this->m_arena).len < len_)) {
    if ((s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        sVar3 = (substr)(*pcVar1)();
        return sVar3;
      }
    }
    handle_error(0x1ff947,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x154e,"num <= len || num == npos");
  }
  if (len_ == 0xffffffffffffffff) {
    len_ = (this->m_arena).len;
  }
  basic_substring<char>::basic_substring(&local_20,(this->m_arena).str,len_);
  return local_20;
}

Assistant:

substr arena() const { return m_arena.first(m_arena_pos); }